

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::getLowerUnscaled(SPxLPBase<double> *this,VectorBase<double> *vec)

{
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  if (this->_isScaled == true) {
    (*this->lp_scaler->_vptr_SPxScaler[0x17])(this->lp_scaler,this,vec);
    return;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&_Stack_28,
             &(this->super_LPColSetBase<double>).low.val);
  std::vector<double,_std::allocator<double>_>::operator=
            (&vec->val,(vector<double,_std::allocator<double>_> *)&_Stack_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void SPxLPBase<R>::getLowerUnscaled(VectorBase<R>& vec) const
{
   if(_isScaled)
      lp_scaler->getLowerUnscaled(*this, vec);
   else
      vec = VectorBase<R>(LPColSetBase<R>::lower());
}